

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O3

void rgbcx::bc1_get_block_colors4
               (uint32_t *block_r,uint32_t *block_g,uint32_t *block_b,uint32_t lr,uint32_t lg,
               uint32_t lb,uint32_t hr,uint32_t hg,uint32_t hb)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  
  *block_r = lr >> 2 | lr * 8;
  *block_g = lg >> 4 | lg * 4;
  *block_b = lb >> 2 | lb * 8;
  block_r[3] = hr >> 2 | hr * 8;
  block_g[3] = hg >> 4 | hg * 4;
  block_b[3] = hb >> 2 | hb * 8;
  if (g_bc1_approx_mode == 3) {
    block_r[1] = (block_r[3] + *block_r * 2 + 1) / 3;
    block_g[1] = (block_g[3] + *block_g * 2 + 1) / 3;
    block_b[1] = (block_b[3] + *block_b * 2 + 1) / 3;
    block_r[2] = (*block_r + block_r[3] * 2 + 1) / 3;
    block_g[2] = (*block_g + block_g[3] * 2 + 1) / 3;
    uVar1 = *block_b + block_b[3] * 2 + 1;
  }
  else {
    if (g_bc1_approx_mode == 2) {
      block_r[1] = (int)(block_r[3] * 0x15 + *block_r * 0x2b + 0x20) >> 6;
      block_g[1] = (int)(block_g[3] * 0x15 + *block_g * 0x2b + 0x20) >> 6;
      block_b[1] = (int)(block_b[3] * 0x15 + *block_b * 0x2b + 0x20) >> 6;
      block_r[2] = (int)(*block_r * 0x15 + block_r[3] * 0x2b + 0x20) >> 6;
      block_g[2] = (int)(*block_g * 0x15 + block_g[3] * 0x2b + 0x20) >> 6;
      uVar1 = (int)(block_b[3] * 0x2b + *block_b * 0x15 + 0x20) >> 6;
      goto LAB_0011f4f3;
    }
    if (g_bc1_approx_mode != 0) {
      iVar2 = hr + lr * 2;
      iVar3 = iVar2 * 0x16;
      iVar2 = iVar2 * 0x16 + 7;
      if (-1 < iVar3) {
        iVar2 = iVar3;
      }
      block_r[1] = iVar2 >> 3;
      iVar3 = block_g[3] - *block_g;
      iVar2 = iVar3 + 3;
      if (-1 < iVar3) {
        iVar2 = iVar3;
      }
      iVar3 = iVar3 * 0x50 + *block_g * 0x100 + (iVar2 >> 2);
      iVar2 = iVar3 + 0x80;
      iVar3 = iVar3 + 0x17f;
      if (-1 < iVar2) {
        iVar3 = iVar2;
      }
      block_g[1] = iVar3 >> 8;
      iVar2 = hb + lb * 2;
      iVar3 = iVar2 * 0x16;
      iVar2 = iVar2 * 0x16 + 7;
      if (-1 < iVar3) {
        iVar2 = iVar3;
      }
      block_b[1] = iVar2 >> 3;
      iVar2 = lr + hr * 2;
      iVar3 = iVar2 * 0x16;
      iVar2 = iVar2 * 0x16 + 7;
      if (-1 < iVar3) {
        iVar2 = iVar3;
      }
      block_r[2] = iVar2 >> 3;
      iVar3 = *block_g - block_g[3];
      iVar2 = iVar3 + 3;
      if (-1 < iVar3) {
        iVar2 = iVar3;
      }
      iVar2 = iVar3 * 0x50 + block_g[3] * 0x100 + (iVar2 >> 2);
      iVar3 = iVar2 + 0x80;
      iVar2 = iVar2 + 0x17f;
      if (-1 < iVar3) {
        iVar2 = iVar3;
      }
      block_g[2] = iVar2 >> 8;
      iVar2 = lb + hb * 2;
      iVar3 = iVar2 * 0x16;
      iVar2 = iVar2 * 0x16 + 7;
      if (-1 < iVar3) {
        iVar2 = iVar3;
      }
      uVar1 = iVar2 >> 3;
      goto LAB_0011f4f3;
    }
    block_r[1] = (*block_r * 2 + block_r[3]) / 3;
    block_g[1] = (*block_g * 2 + block_g[3]) / 3;
    block_b[1] = (*block_b * 2 + block_b[3]) / 3;
    block_r[2] = (block_r[3] * 2 + *block_r) / 3;
    block_g[2] = (block_g[3] * 2 + *block_g) / 3;
    uVar1 = block_b[3] * 2 + *block_b;
  }
  uVar1 = uVar1 / 3;
LAB_0011f4f3:
  block_b[2] = uVar1;
  return;
}

Assistant:

static inline void bc1_get_block_colors4(uint32_t block_r[4], uint32_t block_g[4], uint32_t block_b[4], uint32_t lr, uint32_t lg, uint32_t lb, uint32_t hr, uint32_t hg, uint32_t hb)
	{
		block_r[0] = (lr << 3) | (lr >> 2); block_g[0] = (lg << 2) | (lg >> 4);	block_b[0] = (lb << 3) | (lb >> 2);
		block_r[3] = (hr << 3) | (hr >> 2);	block_g[3] = (hg << 2) | (hg >> 4);	block_b[3] = (hb << 3) | (hb >> 2);

		if (g_bc1_approx_mode == bc1_approx_mode::cBC1Ideal)
		{
			block_r[1] = (block_r[0] * 2 + block_r[3]) / 3;	block_g[1] = (block_g[0] * 2 + block_g[3]) / 3;	block_b[1] = (block_b[0] * 2 + block_b[3]) / 3;
			block_r[2] = (block_r[3] * 2 + block_r[0]) / 3;	block_g[2] = (block_g[3] * 2 + block_g[0]) / 3;	block_b[2] = (block_b[3] * 2 + block_b[0]) / 3;
		}
		else if (g_bc1_approx_mode == bc1_approx_mode::cBC1IdealRound4)
		{
			block_r[1] = (block_r[0] * 2 + block_r[3] + 1) / 3;	block_g[1] = (block_g[0] * 2 + block_g[3] + 1) / 3;	block_b[1] = (block_b[0] * 2 + block_b[3] + 1) / 3;
			block_r[2] = (block_r[3] * 2 + block_r[0] + 1) / 3;	block_g[2] = (block_g[3] * 2 + block_g[0] + 1) / 3;	block_b[2] = (block_b[3] * 2 + block_b[0] + 1) / 3;
		}
		else if (g_bc1_approx_mode == bc1_approx_mode::cBC1AMD)
		{
			block_r[1] = interp_5_6_amd(block_r[0], block_r[3]); block_g[1] = interp_5_6_amd(block_g[0], block_g[3]); block_b[1] = interp_5_6_amd(block_b[0], block_b[3]);
			block_r[2] = interp_5_6_amd(block_r[3], block_r[0]); block_g[2] = interp_5_6_amd(block_g[3], block_g[0]); block_b[2] = interp_5_6_amd(block_b[3], block_b[0]);
		}
		else
		{
			block_r[1] = interp_5_nv(lr, hr); block_g[1] = interp_6_nv(block_g[0], block_g[3]); block_b[1] = interp_5_nv(lb, hb);
			block_r[2] = interp_5_nv(hr, lr); block_g[2] = interp_6_nv(block_g[3], block_g[0]); block_b[2] = interp_5_nv(hb, lb);
		}
	}